

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPTF.cpp
# Opt level: O0

Result * __thiscall
LongestProcessingTimeFirst::operator()
          (Result *__return_storage_ptr__,LongestProcessingTimeFirst *this,
          shared_ptr<Instance> *instance)

{
  Instance *this_00;
  element_type *peVar1;
  shared_ptr<Instance> local_68;
  Task *local_50;
  Task *local_48;
  undefined1 local_30 [8];
  shared_ptr<Instance> SortedInstance;
  shared_ptr<Instance> *instance_local;
  LongestProcessingTimeFirst *this_local;
  
  SortedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)instance;
  this_00 = (Instance *)operator_new(0x20);
  peVar1 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      instance);
  Instance::Instance(this_00,peVar1);
  std::shared_ptr<Instance>::shared_ptr<Instance,void>((shared_ptr<Instance> *)local_30,this_00);
  peVar1 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  local_48 = (Task *)std::vector<Task,_std::allocator<Task>_>::begin(&peVar1->tasks);
  peVar1 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  local_50 = (Task *)std::vector<Task,_std::allocator<Task>_>::end(&peVar1->tasks);
  std::operator()(local_48,local_50);
  std::shared_ptr<Instance>::shared_ptr(&local_68,(shared_ptr<Instance> *)local_30);
  Greedy::operator()(__return_storage_ptr__,&this->super_Greedy,&local_68);
  std::shared_ptr<Instance>::~shared_ptr(&local_68);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Result LongestProcessingTimeFirst::operator()(std::shared_ptr<Instance> instance) {
	//we will manipulate our Instance, so it's better to work on a copy

	std::shared_ptr<Instance> SortedInstance( new Instance(*instance) );

	//descendign sort
	std::sort(SortedInstance->tasks.begin(), SortedInstance->tasks.end(),
	[](Task& a, Task& b){return a.getLength() > b.getLength();});
	
	//descending sort ensures that Greedy Algorithm places longest possible Task in every step
	return Greedy::operator()(SortedInstance);
}